

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O2

string * __thiscall
RigidBodyDynamics::Utils::print_hierarchy_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,Model *model,uint body_index,int indent)

{
  long lVar1;
  long lVar2;
  pointer pFVar3;
  pointer pvVar4;
  Model *this_00;
  string *psVar5;
  ostream *poVar6;
  ulong uVar7;
  int j;
  int iVar8;
  Model *model_00;
  long lVar9;
  uint uVar10;
  allocator<char> local_1f1;
  string local_1f0;
  Model *local_1d0;
  string *local_1c8;
  Model *local_1c0;
  stringstream result;
  ostream local_1a8 [376];
  
  uVar7 = (ulong)body_index;
  model_00 = (Model *)((ulong)model & 0xffffffff);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"",&local_1f1);
  local_1c8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&result,(string *)&local_1f0,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&local_1f0);
  uVar10 = 0;
  if (0 < (int)body_index) {
    uVar10 = body_index;
  }
  while (uVar10 != 0) {
    std::operator<<(local_1a8,"  ");
    uVar10 = uVar10 - 1;
  }
  get_body_name_abi_cxx11_(&local_1f0,this,model_00,(uint)uVar7);
  std::operator<<(local_1a8,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  if ((int)model != 0) {
    std::operator<<(local_1a8," [ ");
  }
  local_1d0 = (Model *)this;
  do {
    if (*(char *)(*(long *)(this + 0x308) + 0x68 + (long)model_00 * 0x70) != '\x01') {
LAB_0010ee77:
      if (model_00 != (Model *)0x0) {
        get_dof_name_abi_cxx11_
                  (&local_1f0,(Utils *)((long)model_00 * 0x30 + *(long *)(this + 0xb8)),
                   (SpatialVector *)model_00);
        poVar6 = std::operator<<(local_1a8,(string *)&local_1f0);
        std::operator<<(poVar6," ]");
        std::__cxx11::string::~string((string *)&local_1f0);
      }
      std::endl<char,std::char_traits<char>>(local_1a8);
      uVar10 = 0;
      local_1c0 = model_00;
      while( true ) {
        this_00 = local_1d0;
        pvVar4 = (local_1d0->mu).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar1 = *(long *)&pvVar4[(long)model_00].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar4[(long)model_00].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data + 8) - lVar1 >> 2) <=
            (ulong)uVar10) break;
        print_hierarchy_abi_cxx11_
                  (&local_1f0,(Utils *)local_1d0,
                   (Model *)(ulong)*(uint *)(lVar1 + (ulong)uVar10 * 4),body_index + 1,indent);
        std::operator<<(local_1a8,(string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        uVar10 = uVar10 + 1;
      }
      uVar10 = 0;
      while( true ) {
        psVar5 = local_1c8;
        pFVar3 = (this_00->mFixedBodies).
                 super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 .
                 super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(this_00->mFixedBodies).
                           super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                           .
                           super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar3) / 0x130) <=
            (ulong)uVar10) break;
        if (pFVar3[uVar10].mMovableParent == (uint)local_1c0) {
          for (iVar8 = 0; iVar8 <= (int)body_index; iVar8 = iVar8 + 1) {
            std::operator<<(local_1a8,"  ");
          }
          Model::GetBodyName_abi_cxx11_
                    (&local_1f0,this_00,this_00->fixed_body_discriminator + uVar10);
          poVar6 = std::operator<<(local_1a8,(string *)&local_1f0);
          poVar6 = std::operator<<(poVar6," [fixed]");
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&local_1f0);
        }
        uVar10 = uVar10 + 1;
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&result);
      return psVar5;
    }
    lVar9 = (long)model_00 * 0x18;
    lVar1 = *(long *)(*(long *)(this + 0x30) + 8 + lVar9);
    lVar2 = *(long *)(*(long *)(this + 0x30) + lVar9);
    if (lVar1 == lVar2) {
      std::operator<<(local_1a8," end");
      goto LAB_0010ee77;
    }
    if (4 < (ulong)(lVar1 - lVar2)) {
      poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      poVar6 = std::operator<<(poVar6,
                               "Error: Cannot determine multi-dof joint as massless body with id ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," (name: ");
      Model::GetBodyName_abi_cxx11_(&local_1f0,(Model *)this,(uint)model_00);
      poVar6 = std::operator<<(poVar6,(string *)&local_1f0);
      poVar6 = std::operator<<(poVar6,") has more than one child:");
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&local_1f0);
      for (uVar10 = 0;
          pvVar4 = (local_1d0->mu).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          (ulong)uVar10 <
          (ulong)((long)*(pointer *)
                         ((long)&pvVar4[(long)model_00].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + 8) -
                  *(long *)&pvVar4[(long)model_00].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 >> 2); uVar10 = uVar10 + 1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"  id: ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," name: ");
        Model::GetBodyName_abi_cxx11_
                  (&local_1f0,local_1d0,
                   *(uint *)(*(long *)&(local_1d0->mu).
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[(long)model_00].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + (ulong)uVar10 * 4));
        poVar6 = std::operator<<(poVar6,(string *)&local_1f0);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::string::~string((string *)&local_1f0);
      }
      abort();
    }
    get_dof_name_abi_cxx11_
              (&local_1f0,(Utils *)((long)model_00 * 0x30 + *(long *)(this + 0xb8)),
               (SpatialVector *)model_00);
    poVar6 = std::operator<<(local_1a8,(string *)&local_1f0);
    std::operator<<(poVar6,", ");
    std::__cxx11::string::~string((string *)&local_1f0);
    model_00 = (Model *)(ulong)**(uint **)(*(long *)(this + 0x30) + lVar9);
  } while( true );
}

Assistant:

std::string print_hierarchy (const RigidBodyDynamics::Model &model, unsigned int body_index = 0, int indent = 0) {
	stringstream result ("");

	for (int j = 0; j < indent; j++)
		result << "  ";

	result << get_body_name (model, body_index);

	if (body_index > 0)
		result << " [ ";

	while (model.mBodies[body_index].mIsVirtual) {
		if (model.mu[body_index].size() == 0) {
			result << " end";
			break;
		} else if (model.mu[body_index].size() > 1) {
			cerr << endl << "Error: Cannot determine multi-dof joint as massless body with id " << body_index << " (name: " << model.GetBodyName(body_index) << ") has more than one child:" << endl;
			for (unsigned int ci = 0; ci < model.mu[body_index].size(); ci++) {
				cerr << "  id: " << model.mu[body_index][ci] << " name: " << model.GetBodyName(model.mu[body_index][ci]) << endl;
			}
			abort();
		}

		result << get_dof_name(model.S[body_index]) << ", ";

		body_index = model.mu[body_index][0];
	}

	if (body_index > 0)
		result << get_dof_name(model.S[body_index]) << " ]";
	result << endl;

	unsigned int child_index = 0;
	for (child_index = 0; child_index < model.mu[body_index].size(); child_index++) {
		result << print_hierarchy (model, model.mu[body_index][child_index], indent + 1);
	}

	// print fixed children
	for (unsigned int fbody_index = 0; fbody_index < model.mFixedBodies.size(); fbody_index++) {
		if (model.mFixedBodies[fbody_index].mMovableParent == body_index) {
			for (int j = 0; j < indent + 1; j++)
				result << "  ";

			result << model.GetBodyName(model.fixed_body_discriminator + fbody_index) << " [fixed]" << endl;
		}
	}


	return result.str();
}